

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O2

void Gia_ManSimplifyXor(Vec_Int_t *vSuper)

{
  int Entry;
  int iVar1;
  uint Entry_00;
  int nSizeNew;
  int i;
  
  iVar1 = -1;
  nSizeNew = 0;
  Entry_00 = 0;
  for (i = 0; i < vSuper->nSize; i = i + 1) {
    Entry = Vec_IntEntry(vSuper,i);
    if (Entry != 0) {
      if (Entry == 1) {
        Entry_00 = Entry_00 ^ 1;
      }
      else if (iVar1 == Entry) {
        nSizeNew = nSizeNew + -1;
        iVar1 = -1;
      }
      else {
        Vec_IntWriteEntry(vSuper,nSizeNew,Entry);
        nSizeNew = nSizeNew + 1;
        iVar1 = Entry;
      }
    }
  }
  Vec_IntShrink(vSuper,nSizeNew);
  if (vSuper->nSize != 0) {
    if (Entry_00 != 0) {
      iVar1 = Vec_IntEntry(vSuper,0);
      iVar1 = Abc_LitNot(iVar1);
      Vec_IntWriteEntry(vSuper,0,iVar1);
      return;
    }
    return;
  }
  Vec_IntPush(vSuper,Entry_00);
  return;
}

Assistant:

void Gia_ManSimplifyXor( Vec_Int_t * vSuper )
{
    int i, k = 0, Prev = -1, This, fCompl = 0;
    Vec_IntForEachEntry( vSuper, This, i )
    {
        if ( This == 0 )
            continue;
        if ( This == 1 )
            fCompl ^= 1; 
        else if ( Prev != This )
            Vec_IntWriteEntry( vSuper, k++, This ), Prev = This;
        else
            Prev = -1, k--;
    }
    Vec_IntShrink( vSuper, k );
    if ( Vec_IntSize( vSuper ) == 0 )
        Vec_IntPush( vSuper, fCompl );
    else if ( fCompl )
        Vec_IntWriteEntry( vSuper, 0, Abc_LitNot(Vec_IntEntry(vSuper, 0)) );
}